

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  value_type vVar6;
  
  uVar3 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
          ::size(&fadexpr->fadexpr_);
  uVar1 = (this->dx_).num_elts;
  if (uVar3 == uVar1) {
    if (uVar3 == 0) goto LAB_00fbbea5;
    pdVar4 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar3 == 0) {
      if (uVar1 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00fbbea5;
    }
    if (uVar1 != 0) {
      pdVar4 = (this->dx_).ptr_to_data;
      if (pdVar4 != (double *)0x0) {
        operator_delete__(pdVar4);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar3;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar5 = (ulong)uVar3 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar5);
    (this->dx_).ptr_to_data = pdVar4;
  }
  bVar2 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
          ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar2) {
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        vVar6 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar5);
        pdVar4[uVar5] = vVar6;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      vVar6 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar5);
      pdVar4[uVar5] = vVar6;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
LAB_00fbbea5:
  vVar6 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
          ::val(&fadexpr->fadexpr_);
  this->val_ = vVar6;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}